

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O0

void __thiscall
CVmImageLoaderMres_resload::add_resource
          (CVmImageLoaderMres_resload *this,char *fname,size_t fnamelen,char *res_name,
          size_t res_name_len)

{
  int iVar1;
  char *pcVar2;
  size_t in_RDI;
  char *in_R8;
  
  if (((*(int *)(in_RDI + 0x18) == 0) && (in_R8 == *(char **)(in_RDI + 0x10))) &&
     (iVar1 = memicmp((void *)fnamelen,res_name,res_name_len), iVar1 == 0)) {
    *(undefined4 *)(in_RDI + 0x18) = 1;
    pcVar2 = lib_copy_str(in_R8,in_RDI);
    *(char **)(in_RDI + 0x28) = pcVar2;
  }
  return;
}

Assistant:

void add_resource(const char *fname, size_t fnamelen,
                      const char *res_name, size_t res_name_len)
    {
        /* 
         *   if we've already found a match, there's no need to consider
         *   anything else 
         */
        if (found_)
            return;

        /* check to see if this is the one we're looking for */
        if (res_name_len == respath_len_
            && memicmp(respath_, res_name, res_name_len) == 0)
        {
            /* we found it */
            found_ = TRUE;

            /* remember the link */
            link_ = lib_copy_str(fname, fnamelen);
        }
    }